

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_stdlib.cpp
# Opt level: O0

bool ImGui::InputTextWithHint
               (char *label,char *hint,string *str,ImGuiInputTextFlags flags,
               ImGuiInputTextCallback callback,void *user_data)

{
  bool bVar1;
  uint uVar2;
  uint in_ECX;
  char *in_RDX;
  char *in_RSI;
  size_t in_R8;
  ImGuiInputTextCallback in_R9;
  void *unaff_retaddr;
  InputTextCallback_UserData cb_user_data;
  ImGuiInputTextCallback p_Var3;
  undefined4 in_stack_ffffffffffffffe0;
  ImGuiInputTextFlags flags_00;
  
  uVar2 = in_ECX | 0x200000;
  p_Var3 = in_R9;
  std::__cxx11::string::c_str();
  flags_00 = (ImGuiInputTextFlags)((ulong)p_Var3 >> 0x20);
  std::__cxx11::string::capacity();
  bVar1 = InputTextWithHint(in_RSI,in_RDX,(char *)CONCAT44(uVar2,in_stack_ffffffffffffffe0),in_R8,
                            flags_00,in_R9,unaff_retaddr);
  return bVar1;
}

Assistant:

bool ImGui::InputTextWithHint(const char* label, const char* hint, std::string* str, ImGuiInputTextFlags flags, ImGuiInputTextCallback callback, void* user_data)
{
    IM_ASSERT((flags & ImGuiInputTextFlags_CallbackResize) == 0);
    flags |= ImGuiInputTextFlags_CallbackResize;

    InputTextCallback_UserData cb_user_data;
    cb_user_data.Str = str;
    cb_user_data.ChainCallback = callback;
    cb_user_data.ChainCallbackUserData = user_data;
    return InputTextWithHint(label, hint, (char*)str->c_str(), str->capacity() + 1, flags, InputTextCallback, &cb_user_data);
}